

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O2

void deblock_edge_chro_hor
               (pel *src,int stride,int alpha_u,int beta_u,int alpha_v,int beta_v,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  pel *ppVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  pel *local_80;
  pel *local_78;
  pel *local_70;
  pel *local_60;
  pel *local_58;
  uint local_48 [6];
  int beta [2];
  int alpha [2];
  
  local_48[2] = alpha_u;
  local_48[3] = alpha_v;
  local_48[0] = beta_u;
  local_48[1] = beta_v;
  uVar15 = (ulong)(~edge_flag * 2 & 4);
  local_70 = src + uVar15;
  local_60 = src + uVar15 + (long)(stride * 2);
  local_78 = src + uVar15 + (long)stride;
  local_58 = src + uVar15 + (long)(stride * -3);
  ppVar12 = src + (uVar15 - (long)stride);
  local_80 = src + (uVar15 - (long)(stride * 2));
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    uVar5 = local_48[lVar10];
    for (lVar17 = 0; (uint)((~edge_flag & 0x202U) == 0) * 4 + 4 != (int)lVar17; lVar17 = lVar17 + 2)
    {
      uVar13 = (uint)local_80[lVar17];
      bVar1 = ppVar12[lVar17];
      uVar16 = (uint)local_70[lVar17];
      bVar2 = local_78[lVar17];
      uVar7 = uVar16 - bVar1;
      uVar6 = -uVar7;
      if (0 < (int)uVar7) {
        uVar6 = uVar7;
      }
      uVar8 = uVar13 - bVar1;
      uVar7 = -uVar8;
      if (0 < (int)uVar8) {
        uVar7 = uVar8;
      }
      uVar9 = (uint)local_70[lVar17] - (uint)bVar2;
      uVar8 = -uVar9;
      if (0 < (int)uVar9) {
        uVar8 = uVar9;
      }
      if (((int)(uVar7 & 0xff) < (int)uVar5) && ((int)(uVar8 & 0xff) < (int)uVar5)) {
        bVar3 = local_58[lVar17];
        bVar4 = local_60[lVar17];
        ppVar12[lVar17] = (pel)((uint)bVar1 * 10 + uVar13 * 3 + uVar16 * 3 + 8 >> 4);
        iVar14 = (uint)bVar1 + (uint)bVar1 * 2;
        local_70[lVar17] = (pel)((uint)bVar2 + (uint)bVar2 * 2 + uVar16 * 10 + iVar14 + 8 >> 4);
        uVar11 = (uint)bVar3 - (uint)bVar1;
        uVar9 = -uVar11;
        if (0 < (int)uVar11) {
          uVar9 = uVar11;
        }
        if (uVar9 < uVar5) {
          uVar11 = bVar4 - uVar16;
          uVar9 = -uVar11;
          if (0 < (int)uVar11) {
            uVar9 = uVar11;
          }
          if ((((uVar9 < uVar5) && ((uVar8 & 0xff) <= uVar5 >> 2)) && ((uVar7 & 0xff) <= uVar5 >> 2)
              ) && ((int)(uVar6 & 0xff) < (int)local_48[lVar10 + 2])) {
            local_80[lVar17] = (pel)((uint)bVar3 * 3 + uVar13 * 8 + iVar14 + uVar16 * 2 + 8 >> 4);
            local_78[lVar17] =
                 (pel)(uVar16 * 3 + (uint)bVar1 * 2 + (uint)bVar2 * 8 + (uint)bVar4 * 3 + 8 >> 4);
          }
        }
      }
    }
    local_70 = local_70 + 1;
    local_60 = local_60 + 1;
    local_78 = local_78 + 1;
    ppVar12 = ppVar12 + 1;
    local_80 = local_80 + 1;
    local_58 = local_58 + 1;
  }
  return;
}

Assistant:

void deblock_edge_chro_hor(pel *src, int stride, int alpha_u, int beta_u, int alpha_v, int beta_v, int edge_flag)
{
    int i, line_size = 4;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int alpha[2] = { alpha_u, alpha_v };
    int beta[2] = { beta_u, beta_v };
    pel *p_src;
    int uv;

    if ((edge_flag & 0x0202) != 0x0202) {
        line_size = 2;
    }
    if (!(edge_flag & 0x2)) {
        src += 4;
    }

    for (uv = 0; uv < 2; uv++) {
        p_src = src + uv;
        for (i = 0; i < line_size; i++, p_src += 2) {
            int L2 = p_src[-inc3];
            int L1 = p_src[-inc2];
            int L0 = p_src[-inc];
            int R0 = p_src[0];
            int R1 = p_src[inc];
            int R2 = p_src[inc2];
            int delta_m = COM_ABS(R0 - L0);
            int delta_l = COM_ABS(L1 - L0);
            int delta_r = COM_ABS(R0 - R1);

            if ((delta_l < beta[uv]) && (delta_r < beta[uv])) {
                p_src[-inc] = (pel)((L1 * 3 + L0 * 10 + R0 * 3 + 8) >> 4);                  // L0
                p_src[0] = (pel)((R1 * 3 + R0 * 10 + L0 * 3 + 8) >> 4);                     // R0
                if ((COM_ABS(L2 - L0) < beta[uv]) && (COM_ABS(R2 - R0) < beta[uv]) && 
                    delta_r <= beta[uv] / 4 && delta_l <= beta[uv] / 4 && delta_m < alpha[uv]) {
                    p_src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 3 + R0 * 2 + 8) >> 4);     // L1
                    p_src[inc] = (pel)((R2 * 3 + R1 * 8 + R0 * 3 + L0 * 2 + 8) >> 4);       // R1
                }
            }
        }
    }
}